

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall
wabt::interp::DefinedFunc::DefinedFunc(DefinedFunc *this,Store *store,Ref instance,FuncDesc *desc)

{
  ValueTypes *__x;
  ValueTypes *__x_00;
  ExternKind EVar1;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_60;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  EVar1 = (desc->type).super_ExternType.kind;
  __x = &(desc->type).params;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_60,__x);
  __x_00 = &(desc->type).results;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,__x_00);
  (this->super_Func).super_Extern.super_Object.kind_ = DefinedFunc;
  *(undefined8 *)
   &(this->super_Func).super_Extern.super_Object.finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_Func).super_Extern.super_Object.finalizer_.super__Function_base._M_functor +
   8) = 0;
  (this->super_Func).super_Extern.super_Object.finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->super_Func).super_Extern.super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Func).super_Extern.super_Object.host_info_ = (void *)0x0;
  (this->super_Func).super_Extern.super_Object.self_.index = 0;
  (this->super_Func).super_Extern.super_Object._vptr_Object = (_func_int **)&PTR__Func_001ebb10;
  (this->super_Func).type_.super_ExternType.kind = EVar1;
  (this->super_Func).type_.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001eb8a0
  ;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&(this->super_Func).type_.params,&local_60);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&(this->super_Func).type_.results,&local_48);
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  (this->super_Func).super_Extern.super_Object._vptr_Object =
       (_func_int **)&PTR__DefinedFunc_001eb698;
  (this->instance_).index = instance.index;
  (this->desc_).type.super_ExternType.kind = (desc->type).super_ExternType.kind;
  (this->desc_).type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001eb8a0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&(this->desc_).type.params,__x);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&(this->desc_).type.results,__x_00);
  std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
            (&(this->desc_).locals,&desc->locals);
  (this->desc_).code_offset = desc->code_offset;
  return;
}

Assistant:

DefinedFunc::DefinedFunc(Store& store, Ref instance, FuncDesc desc)
    : Func(skind, desc.type), instance_(instance), desc_(desc) {}